

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte *pbVar2;
  char cVar3;
  byte bVar4;
  char *pcVar5;
  Ch *pCVar6;
  Ch *pCVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong i;
  ulong uVar13;
  int iVar14;
  SizeType SVar15;
  uint i_00;
  int iVar16;
  byte *pbVar17;
  byte bVar18;
  int iVar19;
  byte *pbVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  cVar3 = *is->src_;
  if (cVar3 == '\"') {
    ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (cVar3 == '[') {
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x328,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartArray(handler);
    if (bVar21) {
      SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                        ,0x333,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar15 = 1;
        while( true ) {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar5 = is->src_;
          if (*pcVar5 != ',') break;
          is->src_ = pcVar5 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          SVar15 = SVar15 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar5 != ']') {
          lVar12 = (long)pcVar5 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_0056b0f4;
        }
        is->src_ = pcVar5 + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,SVar15);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                        ,0x345,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x32c,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar12 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0056b0f4:
    *(long *)(this + 0x38) = lVar12;
    return;
  }
  if (cVar3 == 'f') {
    pcVar5 = is->src_;
    if (*pcVar5 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x372,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar11 = pcVar5 + 1;
    is->src_ = pcVar11;
    if (pcVar5[1] == 'a') {
      pcVar11 = pcVar5 + 2;
      is->src_ = pcVar11;
      if (pcVar5[2] == 'l') {
        pcVar11 = pcVar5 + 3;
        is->src_ = pcVar11;
        if (pcVar5[3] == 's') {
          pcVar11 = pcVar5 + 4;
          is->src_ = pcVar11;
          if (pcVar5[4] == 'e') {
            is->src_ = pcVar5 + 5;
            bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Bool(handler,false);
            if (bVar21) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                            ,0x377,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            lVar12 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            goto LAB_0056ac60;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x37a,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar12 = (long)pcVar11 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0056ac60:
    *(long *)(this + 0x38) = lVar12;
    return;
  }
  if (cVar3 == '{') {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x2e4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::StartObject(handler);
    if (bVar21) {
      SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == '}') {
        is->src_ = is->src_ + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                        ,0x2ef,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar15 = 1;
        while( true ) {
          if (*is->src_ != '\"') {
            lVar12 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 4;
            goto LAB_0056af5b;
          }
          ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar5 = is->src_;
          if (*pcVar5 != ':') {
            lVar12 = (long)pcVar5 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0056af5b;
          }
          is->src_ = pcVar5 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pcVar5 = is->src_;
          if (*pcVar5 != ',') break;
          is->src_ = pcVar5 + 1;
          SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
          SVar15 = SVar15 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pcVar5 != '}') {
          lVar12 = (long)pcVar5 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_0056af5b;
        }
        is->src_ = pcVar5 + 1;
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,SVar15);
        if (bVar21) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                        ,0x314,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x2e8,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar12 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0056af5b:
    *(long *)(this + 0x38) = lVar12;
    return;
  }
  if (cVar3 == 't') {
    pcVar5 = is->src_;
    if (*pcVar5 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x365,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar11 = pcVar5 + 1;
    is->src_ = pcVar11;
    if (pcVar5[1] == 'r') {
      pcVar11 = pcVar5 + 2;
      is->src_ = pcVar11;
      if (pcVar5[2] == 'u') {
        pcVar11 = pcVar5 + 3;
        is->src_ = pcVar11;
        if (pcVar5[3] == 'e') {
          is->src_ = pcVar5 + 4;
          bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Bool(handler,true);
          if (bVar21) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x36a,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar12 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          goto LAB_0056ab84;
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x36d,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar12 = (long)pcVar11 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0056ab84:
    *(long *)(this + 0x38) = lVar12;
    return;
  }
  if (cVar3 == 'n') {
    ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar17 = (byte *)is->src_;
  bVar4 = *pbVar17;
  pbVar20 = pbVar17;
  bVar18 = bVar4;
  if (bVar4 == 0x2d) {
    pbVar20 = pbVar17 + 1;
    bVar18 = pbVar17[1];
  }
  pCVar6 = is->dst_;
  pCVar7 = is->head_;
  if (bVar18 == 0x30) {
    bVar18 = pbVar20[1];
    pbVar20 = pbVar20 + 1;
    uVar13 = 0;
    i_00 = 0;
LAB_0056b2e3:
    bVar21 = false;
    bVar9 = false;
    i = 0;
    dVar22 = 0.0;
    bVar8 = false;
    goto LAB_0056b3b2;
  }
  if ((byte)(bVar18 - 0x31) < 9) {
    i_00 = bVar18 - 0x30;
    uVar13 = 0;
    if (bVar4 == 0x2d) {
      while (bVar18 = pbVar20[uVar13 + 1], (byte)(bVar18 - 0x30) < 10) {
        if (0xccccccb < i_00) {
          uVar10 = i_00;
          if (i_00 != 0xccccccc) goto LAB_0056b279;
          if (0x38 < bVar18) {
            bVar18 = 0x39;
            uVar10 = 0xccccccc;
            goto LAB_0056b279;
          }
        }
        i_00 = (i_00 * 10 + (uint)bVar18) - 0x30;
        uVar13 = uVar13 + 1;
      }
    }
    else {
      while (bVar18 = pbVar20[uVar13 + 1], (byte)(bVar18 - 0x30) < 10) {
        if ((0x19999998 < i_00) &&
           ((uVar10 = i_00, i_00 != 0x19999999 || (uVar10 = 0x19999999, 0x35 < bVar18))))
        goto LAB_0056b279;
        i_00 = (i_00 * 10 + (uint)bVar18) - 0x30;
        uVar13 = uVar13 + 1;
      }
    }
    pbVar20 = pbVar20 + uVar13 + 1;
    goto LAB_0056b2e3;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x5fd,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 3;
  pbVar17 = pbVar20;
  goto LAB_0056b61b;
LAB_0056b279:
  i_00 = uVar10;
  pbVar20 = pbVar20 + uVar13 + 1;
  i = (ulong)i_00;
  if (bVar4 == 0x2d) {
    while ((byte)(bVar18 - 0x30) < 10) {
      if ((0xccccccccccccccb < i) && (0x38 < bVar18 || i != 0xccccccccccccccc)) goto LAB_0056b33a;
      i = (ulong)(bVar18 & 0xf) + i * 10;
      uVar13 = (ulong)((int)uVar13 + 1);
      pbVar1 = pbVar20 + 1;
      pbVar20 = pbVar20 + 1;
      bVar18 = *pbVar1;
    }
  }
  else {
    while ((byte)(bVar18 - 0x30) < 10) {
      if ((0x1999999999999998 < i) && (0x35 < bVar18 || i != 0x1999999999999999)) goto LAB_0056b33a;
      i = (ulong)(bVar18 & 0xf) + i * 10;
      uVar13 = (ulong)((int)uVar13 + 1);
      pbVar1 = pbVar20 + 1;
      pbVar20 = pbVar20 + 1;
      bVar18 = *pbVar1;
    }
  }
  dVar22 = 0.0;
  bVar8 = true;
  bVar21 = false;
  bVar9 = false;
  goto LAB_0056b3b2;
LAB_0056b33a:
  auVar23._8_4_ = (int)(i >> 0x20);
  auVar23._0_8_ = i;
  auVar23._12_4_ = 0x45300000;
  dVar22 = (auVar23._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while ((byte)(bVar18 - 0x30) < 10) {
    if (1.7976931348623158e+307 <= dVar22) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x61e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      goto LAB_0056b611;
    }
    dVar22 = dVar22 * 10.0 + (double)(int)(bVar18 - 0x30);
    pbVar1 = pbVar20 + 1;
    pbVar20 = pbVar20 + 1;
    bVar18 = *pbVar1;
  }
  bVar21 = true;
  bVar9 = true;
  bVar8 = true;
LAB_0056b3b2:
  if (bVar18 == 0x2e) {
    bVar18 = pbVar20[1];
    pbVar20 = pbVar20 + 1;
    if ((byte)(bVar18 - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x62a,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      pbVar17 = pbVar20;
      goto LAB_0056b61b;
    }
    iVar19 = 0;
    if (!bVar21) {
      if (!bVar8) {
        i = (ulong)i_00;
      }
      iVar19 = 0;
      while ((('/' < (char)bVar18 && (bVar18 < 0x3a)) && (i >> 0x35 == 0))) {
        pbVar1 = pbVar20 + 1;
        pbVar20 = pbVar20 + 1;
        iVar19 = iVar19 + -1;
        i = (ulong)(bVar18 - 0x30) + i * 10;
        uVar13 = (ulong)((int)uVar13 + (uint)(i != 0));
        bVar18 = *pbVar1;
      }
      auVar24._8_4_ = (int)(i >> 0x20);
      auVar24._0_8_ = i;
      auVar24._12_4_ = 0x45300000;
      dVar22 = (auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar9 = true;
    }
    while ('/' < (char)bVar18) {
      if (0x39 < bVar18) goto LAB_0056b524;
      if ((int)uVar13 < 0x11) {
        dVar22 = dVar22 * 10.0 + (double)(int)(bVar18 - 0x30);
        iVar19 = iVar19 + -1;
        if (0.0 < dVar22) {
          uVar13 = (ulong)((int)uVar13 + 1);
        }
      }
      pbVar1 = pbVar20 + 1;
      pbVar20 = pbVar20 + 1;
      bVar18 = *pbVar1;
    }
    iVar16 = 0;
LAB_0056b638:
    if (bVar9) {
      dVar22 = internal::StrtodNormalPrecision(dVar22,iVar16 + iVar19);
      if (bVar4 == 0x2d) {
        dVar22 = -dVar22;
      }
      bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Double(handler,dVar22);
    }
    else if (bVar8) {
      if (bVar4 == 0x2d) {
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int64(handler,-i);
      }
      else {
        bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Uint64(handler,i);
      }
    }
    else if (bVar4 == 0x2d) {
      bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Int(handler,-i_00);
    }
    else {
      bVar21 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Uint(handler,i_00);
    }
    if (bVar21 != false) goto LAB_0056b6b2;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x6b6,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0x10;
  }
  else {
    iVar19 = 0;
LAB_0056b524:
    iVar16 = 0;
    if ((bVar18 | 0x20) != 0x65) goto LAB_0056b638;
    uVar13 = (ulong)i_00;
    if (bVar8) {
      uVar13 = i;
    }
    if (!bVar9) {
      auVar25._8_4_ = (int)(uVar13 >> 0x20);
      auVar25._0_8_ = uVar13;
      auVar25._12_4_ = 0x45300000;
      dVar22 = (auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      bVar9 = true;
    }
    bVar18 = pbVar20[1];
    bVar21 = bVar18 != 0x2b;
    if ((bVar21) && (bVar18 != 0x2d)) {
      pbVar20 = pbVar20 + 1;
      bVar21 = false;
    }
    else {
      bVar18 = pbVar20[2];
      pbVar20 = pbVar20 + 2;
    }
    if ((byte)(bVar18 - 0x30) < 10) {
      pbVar20 = pbVar20 + 1;
      iVar14 = bVar18 - 0x30;
      pbVar1 = pbVar20;
      if (bVar21) {
        while (pbVar20 = pbVar1, (byte)(*pbVar20 - 0x30) < 10) {
          iVar14 = iVar14 * 10 + (uint)*pbVar20 + -0x30;
          pbVar1 = pbVar20 + 1;
          if (0xccccccb < iVar14) {
            do {
              pbVar2 = pbVar20 + 1;
              pbVar20 = pbVar20 + 1;
              pbVar1 = pbVar20;
            } while ((byte)(*pbVar2 - 0x30) < 10);
          }
        }
LAB_0056b62f:
        iVar16 = -iVar14;
        if (!bVar21) {
          iVar16 = iVar14;
        }
        goto LAB_0056b638;
      }
      do {
        bVar18 = *pbVar20;
        if (9 < (byte)(bVar18 - 0x30)) goto LAB_0056b62f;
        pbVar20 = pbVar20 + 1;
        iVar14 = iVar14 * 10 + (uint)bVar18 + -0x30;
      } while (iVar14 <= 0x134 - iVar19);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x671,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_0056b611:
      *(undefined4 *)(this + 0x30) = 0xd;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x676,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      pbVar17 = pbVar20;
    }
  }
LAB_0056b61b:
  *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar7;
LAB_0056b6b2:
  is->src_ = (Ch *)pbVar20;
  is->dst_ = pCVar6;
  is->head_ = pCVar7;
  return;
}

Assistant:

Ch Peek() { return *src_; }